

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif_parse.cc
# Opt level: O0

void yy_symbol_print(FILE *yyo,yysymbol_kind_t yykind,YYSTYPE *yyvaluep)

{
  char *pcVar1;
  YYSTYPE *in_RDX;
  yysymbol_kind_t in_ESI;
  FILE *in_RDI;
  char *local_28;
  
  if (in_ESI < YYSYMBOL_YYACCEPT) {
    local_28 = "token";
  }
  else {
    local_28 = "nterm";
  }
  pcVar1 = yysymbol_name(in_ESI);
  fprintf(in_RDI,"%s %s (",local_28,pcVar1);
  yy_symbol_value_print((FILE *)in_RDI,in_ESI,in_RDX);
  fprintf(in_RDI,")");
  return;
}

Assistant:

static void
yy_symbol_print (FILE *yyo,
                 yysymbol_kind_t yykind, YYSTYPE const * const yyvaluep)
{
  YYFPRINTF (yyo, "%s %s (",
             yykind < YYNTOKENS ? "token" : "nterm", yysymbol_name (yykind));

  yy_symbol_value_print (yyo, yykind, yyvaluep);
  YYFPRINTF (yyo, ")");
}